

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_buffer__do_pushv(ptls_buffer_t *buf,void *src,size_t len)

{
  size_t in_RDX;
  ptls_buffer_t *in_RSI;
  long *in_RDI;
  int ret;
  int local_4;
  
  if (in_RDX == 0) {
    local_4 = 0;
  }
  else {
    local_4 = ptls_buffer_reserve(in_RSI,in_RDX);
    if (local_4 == 0) {
      memcpy((void *)(*in_RDI + in_RDI[2]),in_RSI,in_RDX);
      in_RDI[2] = in_RDX + in_RDI[2];
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ptls_buffer__do_pushv(ptls_buffer_t *buf, const void *src, size_t len)
{
    int ret;

    if (len == 0)
        return 0;
    if ((ret = ptls_buffer_reserve(buf, len)) != 0)
        return ret;
    memcpy(buf->base + buf->off, src, len);
    buf->off += len;
    return 0;
}